

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O3

void __thiscall
Basis::Basis(Basis *this,Runtime *rt,vector<int,_std::allocator<int>_> *active,
            vector<BasisStatus,_std::allocator<BasisStatus>_> *status,
            vector<int,_std::allocator<int>_> *inactive)

{
  HighsInt *pHVar1;
  map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  int iVar3;
  mapped_type mVar4;
  iterator iVar5;
  HighsInt HVar6;
  Runtime *pRVar7;
  mapped_type *pmVar8;
  pointer piVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  key_type_conflict1 local_94;
  vector<int,std::allocator<int>> *local_90;
  vector<int,std::allocator<int>> *local_88;
  HVectorBase<double> *local_80;
  HVectorBase<double> *local_78;
  MatrixBase *local_70;
  Runtime *local_68;
  QpVector *local_60;
  QpVector *local_58;
  QpVector *local_50;
  QpVector *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *local_38;
  
  (this->buffer_vec2hvec).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_vec2hvec).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer_vec2hvec).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer_vec2hvec).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_vec2hvec).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_vec2hvec).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_vec2hvec).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_vec2hvec).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_vec2hvec).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer_vec2hvec).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_vec2hvec).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_vec2hvec).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer_vec2hvec).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_vec2hvec).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_vec2hvec).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer_vec2hvec).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_vec2hvec).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_vec2hvec).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = status;
  QpVector::QpVector(&this->Ztprod_res,(rt->instance).num_var);
  local_50 = &this->buffer_Zprod;
  local_48 = &this->Ztprod_res;
  QpVector::QpVector(local_50,(rt->instance).num_var);
  this->runtime = rt;
  (this->basisfactor).refactor_info_.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).refactor_info_.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).refactor_info_.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).refactor_info_.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).refactor_info_.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).refactor_info_.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).refactor_info_.pivot_type.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->basisfactor).refactor_info_.pivot_type.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->basisfactor).refactor_info_.pivot_type.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->basisfactor).a_matrix_valid = false;
  (this->basisfactor).use_original_HFactor_logic = false;
  (this->basisfactor).debug_report_ = false;
  (this->basisfactor).basis_matrix_limit_size = 0;
  (this->basisfactor).update_method = 0;
  (this->basisfactor).build_timer_ = (HighsTimer *)0x0;
  (this->basisfactor).nwork = 0;
  (this->basisfactor).rhs_.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).rhs_.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).rhs_.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).rhs_.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).rhs_.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).rhs_.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).rank_deficiency = 0;
  (this->basisfactor).build_realTick = 0.0;
  (this->basisfactor).build_synthetic_tick = 0.0;
  *(undefined8 *)
   ((long)&(this->basisfactor).var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->basisfactor).var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->basisfactor).var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).kernel_num_el = 0;
  (this->basisfactor).num_row = 0;
  (this->basisfactor).num_col = 0;
  (this->basisfactor).num_basic = 0;
  (this->basisfactor).basis_matrix_num_el = 0;
  (this->basisfactor).invert_num_el = 0;
  (this->basisfactor).kernel_dim = 0;
  (this->basisfactor).kernel_num_el = 0;
  (this->basisfactor).highs_debug_level = 0;
  (this->basisfactor).pivot_threshold = 0.0;
  (this->basisfactor).pivot_tolerance = 0.0;
  (this->basisfactor).a_value = (double *)0x0;
  (this->basisfactor).basic_index = (HighsInt *)0x0;
  (this->basisfactor).a_start = (HighsInt *)0x0;
  (this->basisfactor).a_index = (HighsInt *)0x0;
  *(undefined8 *)((long)&(this->basisfactor).log_options.user_callback._M_invoker + 1) = 0;
  *(undefined8 *)((long)&(this->basisfactor).log_options.user_callback_data + 1) = 0;
  (this->basisfactor).log_options.user_callback.super__Function_base._M_manager = (_Manager_type)0x0
  ;
  (this->basisfactor).log_options.user_callback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->basisfactor).log_options.user_callback.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->basisfactor).log_options.user_callback.super__Function_base._M_functor + 8) = 0;
  (this->basisfactor).log_options.user_log_callback =
       (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
  (this->basisfactor).log_options.user_log_callback_data = (void *)0x0;
  (this->basisfactor).log_options.log_to_console = (bool *)0x0;
  (this->basisfactor).log_options.log_dev_level = (HighsInt *)0x0;
  (this->basisfactor).log_options.log_stream = (FILE *)0x0;
  (this->basisfactor).log_options.output_flag = (bool *)0x0;
  (this->basisfactor).time_limit_ = 0.0;
  (this->basisfactor).log_data._M_t.
  super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
  super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
  super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl = (LogData *)0x0;
  memset(&(this->basisfactor).iwork,0,0x518);
  local_70 = &this->Atran;
  local_40 = &(this->Atran).start;
  local_88 = (vector<int,std::allocator<int>> *)&this->active_constraint_index;
  local_90 = (vector<int,std::allocator<int>> *)&this->non_active_constraint_index;
  this_00 = &this->basisstatus;
  p_Var2 = &(this->basisstatus)._M_t._M_impl.super__Rb_tree_header;
  (this->basisstatus)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->basisstatus)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->basisfactor).rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basisfactor).rhs_.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basisfactor).rhs_.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basisfactor).rhs_.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->updatessinceinvert = 0;
  local_68 = rt;
  memset(local_40,0,0x90);
  pRVar7 = local_68;
  (this->basisstatus)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->basisstatus)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_58 = &this->buffer_column_aq;
  (this->basisstatus)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QpVector::QpVector(local_58,(local_68->instance).num_var);
  local_60 = &this->buffer_row_ep;
  QpVector::QpVector(local_60,(pRVar7->instance).num_var);
  this->buffered_q = -1;
  this->buffered_p = -1;
  local_80 = &this->row_ep;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = &this->col_aq;
  (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->col_aq).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_aq).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->col_aq).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->col_aq).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->col_aq).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->col_aq).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->col_aq).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->col_aq).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->col_aq).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->col_aq).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_aq).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_aq).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->reinversion_hint = false;
  HVectorBase<double>::setup(&this->buffer_vec2hvec,(pRVar7->instance).num_var);
  local_94 = 0;
  iVar3 = (this->runtime->instance).num_con;
  pHVar1 = &(this->runtime->instance).num_var;
  iVar10 = iVar3 + *pHVar1;
  if (iVar10 != 0 && SCARRY4(iVar3,*pHVar1) == iVar10 < 0) {
    do {
      pmVar8 = std::
               map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
               ::operator[](this_00,&local_94);
      *pmVar8 = kInactive;
      local_94 = local_94 + 1;
    } while (local_94 < (this->runtime->instance).num_con + (this->runtime->instance).num_var);
  }
  piVar9 = (active->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((active->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar9) {
    uVar11 = 0;
    do {
      iVar5._M_current =
           (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_88,iVar5,piVar9 + uVar11);
      }
      else {
        *iVar5._M_current = piVar9[uVar11];
        (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      mVar4 = (local_38->super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      pmVar8 = std::
               map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
               ::operator[](this_00,(key_type_conflict1 *)(uVar11 * 4 + *(long *)local_88));
      *pmVar8 = mVar4;
      uVar11 = uVar11 + 1;
      piVar9 = (active->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(active->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar9 >> 2));
  }
  piVar9 = (inactive->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((inactive->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar9) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      iVar5._M_current =
           (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_90,iVar5,(int *)((long)piVar9 + lVar12));
      }
      else {
        *iVar5._M_current = *(int *)((long)piVar9 + lVar12);
        (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      pmVar8 = std::
               map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
               ::operator[](this_00,(key_type_conflict1 *)(*(long *)local_90 + lVar12));
      *pmVar8 = kInactiveInBasis;
      uVar11 = uVar11 + 1;
      piVar9 = (inactive->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 4;
    } while (uVar11 < (ulong)((long)(inactive->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2));
  }
  pRVar7 = local_68;
  if ((local_68->instance).A.has_transpose == false) {
    Matrix::transpose(&(local_68->instance).A);
    (pRVar7->instance).A.has_transpose = true;
  }
  HVar6 = (pRVar7->instance).A.tran.num_col;
  local_70->num_row = (pRVar7->instance).A.tran.num_row;
  local_70->num_col = HVar6;
  std::vector<int,_std::allocator<int>_>::operator=(local_40,&(pRVar7->instance).A.tran.start);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->Atran).index,&(pRVar7->instance).A.tran.index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->Atran).value,&(pRVar7->instance).A.tran.value);
  HVectorBase<double>::setup(local_78,(pRVar7->instance).num_var);
  HVectorBase<double>::setup(local_80,(pRVar7->instance).num_var);
  build(this);
  return;
}

Assistant:

Basis::Basis(Runtime& rt, std::vector<HighsInt> active,
             std::vector<BasisStatus> status, std::vector<HighsInt> inactive)
    : Ztprod_res(rt.instance.num_var),
      buffer_Zprod(rt.instance.num_var),
      runtime(rt),
      buffer_column_aq(rt.instance.num_var),
      buffer_row_ep(rt.instance.num_var) {
  buffer_vec2hvec.setup(rt.instance.num_var);

  for (HighsInt i = 0; i < runtime.instance.num_var + runtime.instance.num_con;
       i++) {
    basisstatus[i] = BasisStatus::kInactive;
  }

  for (size_t i = 0; i < active.size(); i++) {
    active_constraint_index.push_back(active[i]);
    basisstatus[active_constraint_index[i]] = status[i];
  }
  for (size_t i = 0; i < inactive.size(); i++) {
    non_active_constraint_index.push_back(inactive[i]);
    basisstatus[non_active_constraint_index[i]] = BasisStatus::kInactiveInBasis;
  }

  Atran = rt.instance.A.t();

  col_aq.setup(rt.instance.num_var);
  row_ep.setup(rt.instance.num_var);

  build();
}